

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O0

CMFormat INT_CMregister_format(CManager cm,FMStructDescList format_list)

{
  long *size;
  void *pvVar1;
  undefined8 *in_RSI;
  CMFormat in_RDI;
  CMFormat format;
  size_t in_stack_ffffffffffffffe0;
  CManager in_stack_fffffffffffffff8;
  CMFormat p_Var2;
  
  if ((in_RSI == (undefined8 *)0x0) || (in_RDI == (CMFormat)0x0)) {
    p_Var2 = (CMFormat)0x0;
  }
  else {
    size = (long *)INT_CMmalloc(in_stack_ffffffffffffffe0);
    *size = (long)in_RDI;
    strlen((char *)*in_RSI);
    pvVar1 = INT_CMmalloc((size_t)size);
    size[1] = (long)pvVar1;
    strcpy((char *)size[1],(char *)*in_RSI);
    size[2] = 0;
    size[4] = (long)in_RSI;
    size[5] = 0;
    size[6] = 0;
    size[7] = (long)in_RSI;
    *(undefined4 *)(size + 8) = 1;
    p_Var2 = add_format_to_cm(in_stack_fffffffffffffff8,in_RDI);
  }
  return p_Var2;
}

Assistant:

CMFormat
INT_CMregister_format(CManager cm, FMStructDescList format_list)
{
    CMFormat format;

    if ((format_list == NULL) || (cm == NULL)) 
	return NULL;

    format = INT_CMmalloc(sizeof(struct _CMFormat));
    
    format->cm = cm;
    format->format_name = INT_CMmalloc(strlen(format_list[0].format_name) + 1);
    strcpy(format->format_name, format_list[0].format_name);
    format->fmformat = NULL;
    format->format_list_addr = format_list;
    format->handler = (CMHandlerFunc) NULL;
    format->client_data = NULL;
    format->format_list = format_list;
    format->registration_pending = 1;

    format = add_format_to_cm(cm, format);
    return format;
}